

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listener.c
# Opt level: O0

void listener_register_stats(nni_listener *l)

{
  uint32_t id;
  nni_listener *l_local;
  
  nni_stat_set_id(&l->st_root,l->l_id);
  nni_stat_set_id(&l->st_id,l->l_id);
  id = nni_sock_id(l->l_sock);
  nni_stat_set_id(&l->st_sock,id);
  nni_stat_register(&l->st_root);
  return;
}

Assistant:

static void
listener_register_stats(nni_listener *l)
{
#ifdef NNG_ENABLE_STATS
	nni_stat_set_id(&l->st_root, (int) l->l_id);
	nni_stat_set_id(&l->st_id, (int) l->l_id);
	nni_stat_set_id(&l->st_sock, (int) nni_sock_id(l->l_sock));
	nni_stat_register(&l->st_root);
#else
	NNI_ARG_UNUSED(l);
#endif
}